

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O0

int allow_ab_partition_search
              (PartitionSearchState *part_search_state,PARTITION_SPEED_FEATURES *part_sf,
              PARTITION_TYPE curr_best_part,int must_find_valid_partition,int prune_ext_part_state,
              int64_t best_rdcost)

{
  _Bool _Var1;
  int in_ECX;
  char in_DL;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  long in_R9;
  int ab_partition_allowed;
  BLOCK_SIZE ab_bsize_thresh;
  BLOCK_SIZE bsize;
  PartitionBlkParams blk_params;
  byte local_65;
  BLOCK_SIZE local_5e;
  PartitionBlkParams local_5c;
  long local_30;
  int local_24;
  int local_20;
  char local_19;
  long local_18;
  long local_10;
  uint local_4;
  
  local_30 = in_R9;
  local_24 = in_R8D;
  local_20 = in_ECX;
  local_19 = in_DL;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memcpy(&local_5c,(void *)(in_RDI + 8),0x2c);
  if (local_30 == 0x7fffffffffffffff) {
    local_4 = 1;
  }
  else {
    local_5e = *(BLOCK_SIZE *)(local_18 + 0x5c);
    if ((((*(int *)(local_18 + 0x60) != 0) && (local_20 == 0)) && (local_19 != '\x01')) &&
       (local_19 != '\x02')) {
      local_5e = BLOCK_128X128;
    }
    local_65 = 0;
    if ((*(int *)(local_10 + 0x128) != 0) && (local_65 = 0, local_5e < local_5c.bsize)) {
      _Var1 = av1_blk_has_rows_and_cols(&local_5c);
      local_65 = 0;
      if (_Var1) {
        local_65 = local_24 != 0 ^ 0xff;
      }
    }
    local_4 = (uint)(local_65 & 1);
  }
  return local_4;
}

Assistant:

static int allow_ab_partition_search(PartitionSearchState *part_search_state,
                                     PARTITION_SPEED_FEATURES *part_sf,
                                     PARTITION_TYPE curr_best_part,
                                     int must_find_valid_partition,
                                     int prune_ext_part_state,
                                     int64_t best_rdcost) {
  const PartitionBlkParams blk_params = part_search_state->part_blk_params;
  const BLOCK_SIZE bsize = blk_params.bsize;

  // Do not prune if there is no valid partition
  if (best_rdcost == INT64_MAX) return 1;

  // Determine bsize threshold to evaluate ab partitions
  BLOCK_SIZE ab_bsize_thresh = part_sf->ext_partition_eval_thresh;
  if (part_sf->ext_part_eval_based_on_cur_best && !must_find_valid_partition &&
      !(curr_best_part == PARTITION_HORZ || curr_best_part == PARTITION_VERT))
    ab_bsize_thresh = BLOCK_128X128;

  // ab partitions are only allowed for square block sizes BLOCK_16X16 or
  // higher, so ab_bsize_thresh must be large enough to exclude BLOCK_4X4 and
  // BLOCK_8X8.
  assert(ab_bsize_thresh >= BLOCK_8X8);

  int ab_partition_allowed =
      part_search_state->do_rectangular_split && bsize > ab_bsize_thresh &&
      av1_blk_has_rows_and_cols(&blk_params) && !prune_ext_part_state;

  return ab_partition_allowed;
}